

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O3

bool __thiscall btLemkeAlgorithm::greaterZero(btLemkeAlgorithm *this,btVectorXf *vector)

{
  float *pfVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)(vector->m_storage).m_size;
  if ((long)uVar3 < 1) {
    return true;
  }
  pfVar1 = (vector->m_storage).m_data;
  if (*pfVar1 <= 0.0 && *pfVar1 != 0.0) {
    return false;
  }
  uVar2 = 1;
  do {
    uVar4 = uVar2;
    if (uVar3 == uVar4) break;
    uVar2 = uVar4 + 1;
  } while (0.0 < pfVar1[uVar4] || pfVar1[uVar4] == 0.0);
  return uVar3 <= uVar4;
}

Assistant:

bool btLemkeAlgorithm::greaterZero(const btVectorXu & vector)
{
    bool isGreater = true;
    for (int i = 0; i < vector.size(); i++) {
      if (vector[i] < 0) {
        isGreater = false;
        break;
      }
    }

    return isGreater;
  }